

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test::
~TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test
          (TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test *this)

{
  TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test *this_local;
  
  ~TEST_TestMemoryAccountant_reportAllocationsWithSizeZero_Test(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportAllocationsWithSizeZero)
{
    accountant.dealloc(0);

    accountant.dealloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);

    STRCMP_EQUAL("CppUTest Memory Accountant report:\n"
                 "Allocation size     # allocations    # deallocations   max # allocations at one time\n"
                 "other                   0                1                 0\n"
                 "    4                   1                2                 1\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}